

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86.cpp
# Opt level: O0

int __thiscall ncnn::ReLU_x86::forward_inplace(ReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float *pfVar2;
  long *in_RSI;
  long in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m128 _neg;
  __m128 _pos;
  __m128 _p_1;
  __m128 _slope;
  __m128 _zero_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m128 _p;
  __m128 _zero;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  int elembits;
  Mat *m_1;
  Mat *m;
  int local_45c;
  undefined8 local_428;
  undefined8 uStackY_420;
  int local_3f4;
  undefined1 (*local_3a8) [16];
  int local_3a0;
  float local_39c;
  undefined8 local_398;
  undefined8 uStackY_390;
  Option *in_stack_fffffffffffffc78;
  Mat *in_stack_fffffffffffffc80;
  ReLU_x86 *in_stack_fffffffffffffc88;
  int local_370;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined4 local_348;
  long local_340;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined4 local_32c;
  undefined4 local_328;
  undefined8 local_320;
  undefined1 (*local_318) [16];
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  long *local_2e8;
  int local_2d4;
  undefined1 local_2ad;
  int local_2ac;
  undefined8 *local_2a0;
  undefined8 *local_290;
  undefined8 *local_278;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 (*local_230) [16];
  undefined1 local_208 [16];
  undefined1 (*local_1f0) [16];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  long local_120;
  undefined4 local_114;
  long local_110;
  undefined1 (*local_108) [16];
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_58;
  
  if ((int)in_RSI[3] == 0) {
    local_45c = 0;
  }
  else {
    local_45c = (int)((long)((ulong)(uint)((int)(in_RSI[2] << 3) >> 0x1f) << 0x20 |
                            in_RSI[2] << 3 & 0xffffffffU) / (long)(int)in_RSI[3]);
  }
  local_2f4 = local_45c;
  if (local_45c == 8) {
    local_2d4 = forward_inplace_int8
                          (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                           in_stack_fffffffffffffc78);
  }
  else {
    local_2f8 = *(int *)((long)in_RSI + 0x2c);
    local_2fc = (int)in_RSI[6];
    local_300 = *(int *)((long)in_RSI + 0x34);
    local_304 = (int)in_RSI[7];
    local_308 = (int)in_RSI[3];
    local_30c = local_2f8 * local_2fc * local_300 * local_308;
    if ((*(float *)(in_RDI + 0xd0) != 0.0) || (NAN(*(float *)(in_RDI + 0xd0)))) {
      for (local_3a0 = 0; local_3a0 < local_304; local_3a0 = local_3a0 + 1) {
        local_3a8 = (undefined1 (*) [16])(*in_RSI + in_RSI[8] * (long)local_3a0 * in_RSI[2]);
        local_3f4 = 0;
        fVar1 = *(float *)(in_RDI + 0xd0);
        for (; local_3f4 + 3 < local_30c; local_3f4 = local_3f4 + 4) {
          auVar3 = maxps(ZEXT816(0),*local_3a8);
          auVar4 = minps(ZEXT816(0),*local_3a8);
          local_148 = auVar4._0_4_;
          fStack_144 = auVar4._4_4_;
          fStack_140 = auVar4._8_4_;
          fStack_13c = auVar4._12_4_;
          local_158 = auVar3._0_4_;
          fStack_154 = auVar3._4_4_;
          fStack_150 = auVar3._8_4_;
          fStack_14c = auVar3._12_4_;
          local_428 = CONCAT44(fStack_154 + fVar1 * fStack_144,local_158 + fVar1 * local_148);
          uStackY_420 = CONCAT44(fStack_14c + fVar1 * fStack_13c,fStack_150 + fVar1 * fStack_140);
          *(undefined8 *)*local_3a8 = local_428;
          *(undefined8 *)(*local_3a8 + 8) = uStackY_420;
          local_3a8 = local_3a8 + 1;
        }
        for (; local_3f4 < local_30c; local_3f4 = local_3f4 + 1) {
          if (*(float *)*local_3a8 <= 0.0 && *(float *)*local_3a8 != 0.0) {
            *(float *)*local_3a8 = *(float *)(in_RDI + 0xd0) * *(float *)*local_3a8;
          }
          local_3a8 = (undefined1 (*) [16])(*local_3a8 + 4);
        }
      }
    }
    else {
      local_2e8 = in_RSI;
      for (local_310 = 0; local_310 < local_304; local_310 = local_310 + 1) {
        local_2a0 = &local_360;
        local_f4 = *(int *)((long)local_2e8 + 0x2c);
        local_f8 = (int)local_2e8[6];
        local_fc = *(undefined4 *)((long)local_2e8 + 0x34);
        local_108 = (undefined1 (*) [16])
                    (*local_2e8 + local_2e8[8] * (long)local_310 * local_2e8[2]);
        local_110 = local_2e8[2];
        local_114 = (undefined4)local_2e8[3];
        local_120 = local_2e8[4];
        local_f0 = &local_360;
        local_98 = (long)local_f4 * (long)local_f8 * local_110;
        local_290 = &local_360;
        local_278 = &local_360;
        local_9c = 0x10;
        local_2ac = local_310;
        local_2ad = 1;
        local_360 = 0;
        local_350 = 0;
        local_348 = 0;
        local_338 = 0;
        local_334 = 0;
        local_330 = 0;
        local_32c = 0;
        local_328 = 0;
        local_320 = 0;
        local_358 = 0;
        local_248 = 0;
        uStack_240 = 0;
        local_318 = local_108;
        for (local_370 = 0; local_58 = local_278, local_340 = local_120, local_370 + 3 < local_30c;
            local_370 = local_370 + 4) {
          local_230 = local_318;
          local_398 = *(undefined8 *)*local_318;
          uStackY_390 = *(undefined8 *)(*local_318 + 8);
          local_1f0 = local_318;
          local_1b8 = 0;
          uStack_1b0 = 0;
          local_208 = maxps(ZEXT816(0),*local_318);
          *(undefined8 *)*local_318 = local_208._0_8_;
          *(undefined8 *)(*local_318 + 8) = local_208._8_8_;
          local_318 = local_318 + 1;
          local_1c8 = local_398;
          uStack_1c0 = uStackY_390;
        }
        for (; local_370 < local_30c; local_370 = local_370 + 1) {
          local_39c = 0.0;
          pfVar2 = std::max<float>((float *)local_318,&local_39c);
          *(float *)*local_318 = *pfVar2;
          local_318 = (undefined1 (*) [16])(*local_318 + 4);
        }
      }
    }
    local_2d4 = 0;
  }
  return local_2d4;
}

Assistant:

int ReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, _mm512_max_ps(_zero_avx512, _p));
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, _mm256_max_ps(_zero_avx, _p));
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                _mm_store_ps(ptr, _mm_max_ps(_zero, _p));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *ptr = std::max(*ptr, 0.f);
                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            __m512 _slope_avx512 = _mm512_set1_ps(slope);
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __mmask16 _is_negative = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_LT_OQ);
                _p = _mm512_mask_mul_ps(_p, _is_negative, _p, _slope_avx512);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            __m256 _slope_avx = _mm256_set1_ps(slope);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _pos = _mm256_max_ps(_zero_avx, _p);
                __m256 _neg = _mm256_min_ps(_zero_avx, _p);
                _p = _mm256_add_ps(_pos, _mm256_mul_ps(_slope_avx, _neg));
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            __m128 _slope = _mm_set1_ps(slope);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _pos = _mm_max_ps(_zero, _p);
                __m128 _neg = _mm_min_ps(_zero, _p);
                _p = _mm_add_ps(_pos, _mm_mul_ps(_slope, _neg));
                _mm_store_ps(ptr, _p);
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}